

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

BDD make_random(int i,int j)

{
  int iVar1;
  BDD a;
  BDD a_00;
  MTBDD MVar2;
  BDD high;
  BDD low;
  
  if (i == j) {
    iVar1 = rng(0,2);
    return (ulong)(iVar1 != 0) << 0x3f;
  }
  a = make_random(i + 1,j);
  a_00 = make_random(i + 1,j);
  iVar1 = rng(0,4);
  high = a_00;
  low = a;
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      mtbdd_deref(a_00);
      return a;
    }
    high = a;
    low = a_00;
    if (iVar1 == 0) {
      mtbdd_deref(a);
      return a_00;
    }
  }
  MVar2 = mtbdd_makenode(i,low,high);
  MVar2 = mtbdd_ref(MVar2);
  mtbdd_deref(a_00);
  mtbdd_deref(a);
  return MVar2;
}

Assistant:

static inline BDD
make_random(int i, int j)
{
    if (i == j) return rng(0, 2) ? sylvan_true : sylvan_false;

    BDD yes = make_random(i+1, j);
    BDD no = make_random(i+1, j);
    BDD result = sylvan_invalid;

    switch(rng(0, 4)) {
    case 0:
        result = no;
        sylvan_deref(yes);
        break;
    case 1:
        result = yes;
        sylvan_deref(no);
        break;
    case 2:
        result = sylvan_ref(sylvan_makenode(i, yes, no));
        sylvan_deref(no);
        sylvan_deref(yes);
        break;
    case 3:
    default:
        result = sylvan_ref(sylvan_makenode(i, no, yes));
        sylvan_deref(no);
        sylvan_deref(yes);
        break;
    }

    return result;
}